

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O0

bool __thiscall GraphViewer::rearrange(GraphViewer *this)

{
  Connection *this_00;
  bool bVar1;
  allocator local_31;
  string local_30 [32];
  GraphViewer *local_10;
  GraphViewer *this_local;
  
  this_00 = this->con;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"rearrange\n",&local_31);
  bVar1 = Connection::sendMsg(this_00,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return bVar1;
}

Assistant:

bool GraphViewer::rearrange() {
	return con->sendMsg("rearrange\n");
}